

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_StringGetTemplate::Run(void)

{
  byte bVar1;
  Template *pTVar2;
  long lVar3;
  TemplateString local_5e0;
  TemplateString local_5c0;
  TemplateString local_5a0;
  TemplateString local_580;
  TemplateString local_560;
  TemplateString local_540;
  TemplateString local_520;
  TemplateString local_500;
  TemplateString local_4e0;
  TemplateString local_4c0;
  TemplateString local_4a0;
  TemplateString local_480;
  TemplateString local_460;
  TemplateString local_440;
  TemplateString local_420;
  TemplateString local_400;
  TemplateString local_3e0;
  TemplateString local_3c0;
  TemplateString local_3a0;
  TemplateString local_380;
  TemplateString local_360;
  TemplateString local_340;
  allocator local_319;
  string local_318 [32];
  TemplateString local_2f8;
  Template *local_2d8;
  Template *tpl3;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  TemplateString local_180;
  Template *local_160;
  Template *tpl2;
  Template *local_138;
  Template *tpl1;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_c0;
  char *local_a0;
  char *tpltext;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpltext,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&tpltext,(UnsafeArena *)0x0);
  local_a0 = "{This is perfectly valid} yay!";
  ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
  ctemplate::TemplateString::TemplateString(&local_f0,"{This is perfectly valid} yay!");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_f0);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x48e,"Template::StringToTemplateCache(\"tgt\", tpltext)")
    ;
    ctemplate::TemplateString::TemplateString(&local_110,"tgt");
    ctemplate::TemplateString::TemplateString
              ((TemplateString *)&tpl1,"{This is perfectly valid} yay!");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_110,(TemplateString *)&tpl1);
    if ((bVar1 & 1) == 0) {
      __assert_fail("Template::StringToTemplateCache(\"tgt\", tpltext)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x48e,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl2,"tgt");
  local_138 = (Template *)ctemplate::Template::GetTemplate((TemplateString *)&tpl2,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString(&local_180,"tgt");
  local_160 = (Template *)ctemplate::Template::GetTemplate(&local_180,STRIP_WHITESPACE);
  pTVar2 = local_138;
  if ((local_138 == (Template *)0x0) || (local_160 == (Template *)0x0)) {
    printf("ASSERT FAILED, line %d: %s\n",0x492,"tpl1 && tpl2");
    if (local_138 == (Template *)0x0 || local_160 == (Template *)0x0) {
      __assert_fail("tpl1 && tpl2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x492,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  if (local_138 == local_160) {
    printf("ASSERT FAILED, line %d: %s\n",0x493,"tpl1 != tpl2");
    if (local_138 != local_160) {
      exit(1);
    }
    __assert_fail("tpl1 != tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x493,"static void Test_Template_StringGetTemplate::Run()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"{This is perfectly valid} yay!",&local_1a1);
  ctemplate::AssertExpandIs(pTVar2,local_78,(string *)local_1a0,true);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pTVar2 = local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"{This is perfectly valid} yay!",&local_1c9);
  ctemplate::AssertExpandIs(pTVar2,local_78,(string *)local_1c8,true);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  ctemplate::TemplateString::TemplateString(&local_1f0,"tgt");
  ctemplate::TemplateString::TemplateString(&local_210,"{This is perfectly valid} yay!");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_1f0,&local_210);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x499,"!Template::StringToTemplateCache(\"tgt\", tpltext)"
          );
    ctemplate::TemplateString::TemplateString(&local_230,"tgt");
    ctemplate::TemplateString::TemplateString(&local_250,"{This is perfectly valid} yay!");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_230,&local_250);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt\", tpltext)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x499,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_270,"tgt");
  ctemplate::TemplateString::TemplateString(&local_290,"new text");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_270,&local_290);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x49a,
           "!Template::StringToTemplateCache(\"tgt\", \"new text\")");
    ctemplate::TemplateString::TemplateString(&local_2b0,"tgt");
    ctemplate::TemplateString::TemplateString((TemplateString *)&tpl3,"new text");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_2b0,(TemplateString *)&tpl3);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt\", \"new text\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x49a,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2f8,"tgt");
  pTVar2 = (Template *)ctemplate::Template::GetTemplate(&local_2f8,DO_NOT_STRIP);
  local_2d8 = pTVar2;
  if (pTVar2 != local_138) {
    printf("ASSERT FAILED, line %d: %s\n",0x49c,"tpl3 == tpl1");
    if (local_2d8 == local_138) {
      exit(1);
    }
    __assert_fail("tpl3 == tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x49c,"static void Test_Template_StringGetTemplate::Run()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"{This is perfectly valid} yay!",&local_319);
  ctemplate::AssertExpandIs(pTVar2,local_78,(string *)local_318,true);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  ctemplate::TemplateString::TemplateString(&local_340,"tgt2");
  ctemplate::TemplateString::TemplateString(&local_360,"{{This has spaces}}");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_340,&local_360);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4a0,
           "!Template::StringToTemplateCache(\"tgt2\", \"{{This has spaces}}\")");
    ctemplate::TemplateString::TemplateString(&local_380,"tgt2");
    ctemplate::TemplateString::TemplateString(&local_3a0,"{{This has spaces}}");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_380,&local_3a0);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt2\", \"{{This has spaces}}\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4a0,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_3c0,"tgt3");
  ctemplate::TemplateString::TemplateString(&local_3e0,"{{#SEC}}foo");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_3c0,&local_3e0);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4a1,
           "!Template::StringToTemplateCache(\"tgt3\", \"{{#SEC}}foo\")");
    ctemplate::TemplateString::TemplateString(&local_400,"tgt3");
    ctemplate::TemplateString::TemplateString(&local_420,"{{#SEC}}foo");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_400,&local_420);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt3\", \"{{#SEC}}foo\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4a1,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_440,"tgt4");
  ctemplate::TemplateString::TemplateString(&local_460,"{{#S1}}foo{{/S2}}");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_440,&local_460);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4a2,
           "!Template::StringToTemplateCache(\"tgt4\", \"{{#S1}}foo{{/S2}}\")");
    ctemplate::TemplateString::TemplateString(&local_480,"tgt4");
    ctemplate::TemplateString::TemplateString(&local_4a0,"{{#S1}}foo{{/S2}}");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_480,&local_4a0);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt4\", \"{{#S1}}foo{{/S2}}\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4a2,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_4c0,"tgt5");
  ctemplate::TemplateString::TemplateString(&local_4e0,"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_4c0,&local_4e0);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4a4,
           "!Template::StringToTemplateCache(\"tgt5\", \"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}\")");
    ctemplate::TemplateString::TemplateString(&local_500,"tgt5");
    ctemplate::TemplateString::TemplateString(&local_520,"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_500,&local_520);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt5\", \"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4a4,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_540,"tgt6");
  ctemplate::TemplateString::TemplateString(&local_560,"{{noend");
  bVar1 = ctemplate::Template::StringToTemplateCache(&local_540,&local_560);
  if ((bVar1 & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4a5,
           "!Template::StringToTemplateCache(\"tgt6\", \"{{noend\")");
    ctemplate::TemplateString::TemplateString(&local_580,"tgt6");
    ctemplate::TemplateString::TemplateString(&local_5a0,"{{noend");
    bVar1 = ctemplate::Template::StringToTemplateCache(&local_580,&local_5a0);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!Template::StringToTemplateCache(\"tgt6\", \"{{noend\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4a5,"static void Test_Template_StringGetTemplate::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_5c0,"tgt2");
  lVar3 = ctemplate::Template::GetTemplate(&local_5c0,STRIP_WHITESPACE);
  if (lVar3 == 0) {
    ctemplate::Template::ClearCache();
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x4a7,"!Template::GetTemplate(\"tgt2\", STRIP_WHITESPACE)");
  ctemplate::TemplateString::TemplateString(&local_5e0,"tgt2");
  lVar3 = ctemplate::Template::GetTemplate(&local_5e0,STRIP_WHITESPACE);
  if (lVar3 != 0) {
    __assert_fail("!Template::GetTemplate(\"tgt2\", STRIP_WHITESPACE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x4a7,"static void Test_Template_StringGetTemplate::Run()");
  }
  exit(1);
}

Assistant:

TEST(Template, StringGetTemplate) {
  TemplateDictionary dict("dict");

  // Test cache lookups
  const char* const tpltext = "{This is perfectly valid} yay!";
  ASSERT(Template::StringToTemplateCache("tgt", tpltext));

  Template* tpl1 = Template::GetTemplate("tgt", DO_NOT_STRIP);
  Template* tpl2 = Template::GetTemplate("tgt", STRIP_WHITESPACE);
  ASSERT(tpl1 && tpl2);
  ASSERT(tpl1 != tpl2);
  AssertExpandIs(tpl1, &dict, tpltext, true);
  AssertExpandIs(tpl2, &dict, tpltext, true);

  // If we register a new string under the same text, it should be
  // ignored.
  ASSERT(!Template::StringToTemplateCache("tgt", tpltext));
  ASSERT(!Template::StringToTemplateCache("tgt", "new text"));
  Template* tpl3 = Template::GetTemplate("tgt", DO_NOT_STRIP);
  ASSERT(tpl3 == tpl1);
  AssertExpandIs(tpl3, &dict, tpltext, true);

  // Tests that syntax errors cause us to return NULL
  ASSERT(!Template::StringToTemplateCache("tgt2", "{{This has spaces}}"));
  ASSERT(!Template::StringToTemplateCache("tgt3", "{{#SEC}}foo"));
  ASSERT(!Template::StringToTemplateCache("tgt4", "{{#S1}}foo{{/S2}}"));
  ASSERT(!Template::StringToTemplateCache("tgt5",
                                          "{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}"));
  ASSERT(!Template::StringToTemplateCache("tgt6", "{{noend"));
  // And that we didn't cache them by mistake
  ASSERT(!Template::GetTemplate("tgt2", STRIP_WHITESPACE));

  Template::ClearCache();
}